

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.hpp
# Opt level: O0

Uint32 __thiscall Diligent::QueryVkImpl::GetQueryPoolIndex(QueryVkImpl *this,Uint32 QueryId)

{
  Char *Message;
  const_reference pvVar1;
  char (*in_RCX) [67];
  undefined1 local_38 [8];
  string msg;
  Uint32 QueryId_local;
  QueryVkImpl *this_local;
  
  msg.field_2._12_4_ = QueryId;
  if ((QueryId != 0) &&
     (((this->super_QueryBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
       .m_Desc.Type != QUERY_TYPE_DURATION || (QueryId != 1)))) {
    FormatString<char[26],char[67]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"QueryId == 0 || m_Desc.Type == QUERY_TYPE_DURATION && QueryId == 1",
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetQueryPoolIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/QueryVkImpl.hpp"
               ,0x40);
    std::__cxx11::string::~string((string *)local_38);
  }
  pvVar1 = std::array<unsigned_int,_2UL>::operator[]
                     ((array<unsigned_int,_2UL> *)
                      &(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44,
                      (ulong)(uint)msg.field_2._12_4_);
  return *pvVar1;
}

Assistant:

Uint32 GetQueryPoolIndex(Uint32 QueryId) const
    {
        VERIFY_EXPR(QueryId == 0 || m_Desc.Type == QUERY_TYPE_DURATION && QueryId == 1);
        return m_QueryPoolIndex[QueryId];
    }